

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmevent.c
# Opt level: O0

void lj_vmevent_call(lua_State *L,ptrdiff_t argbase)

{
  undefined1 uVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  long in_RSI;
  long in_RDI;
  int status;
  uint8_t oldh;
  uint8_t oldmask;
  global_State *g;
  char *local_28;
  
  uVar4 = (ulong)*(uint *)(in_RDI + 8);
  uVar1 = *(undefined1 *)(uVar4 + 0x10b);
  bVar2 = *(byte *)(uVar4 + 0x109);
  *(undefined1 *)(uVar4 + 0x10b) = 0;
  *(byte *)(uVar4 + 0x109) = *(byte *)(uVar4 + 0x109) | 0x30;
  iVar3 = lj_vm_pcall(in_RDI,(ulong)*(uint *)(in_RDI + 0x24) + in_RSI,1,0);
  if (iVar3 != 0) {
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -8;
    fputs("VM handler failed: ",_stderr);
    if (*(int *)(*(long *)(in_RDI + 0x18) + 4) == -5) {
      local_28 = (char *)((ulong)**(uint **)(in_RDI + 0x18) + 0x10);
    }
    else {
      local_28 = "?";
    }
    fputs(local_28,_stderr);
    fputc(10,_stderr);
  }
  *(byte *)(uVar4 + 0x109) = *(byte *)(uVar4 + 0x109) & 0xf | bVar2 & 0xf0;
  if (*(char *)(uVar4 + 0x10b) != -1) {
    *(undefined1 *)(uVar4 + 0x10b) = uVar1;
  }
  return;
}

Assistant:

void lj_vmevent_call(lua_State *L, ptrdiff_t argbase)
{
  global_State *g = G(L);
  uint8_t oldmask = g->vmevmask;
  uint8_t oldh = hook_save(g);
  int status;
  g->vmevmask = 0;  /* Disable all events. */
  hook_vmevent(g);
  status = lj_vm_pcall(L, restorestack(L, argbase), 0+1, 0);
  if (LJ_UNLIKELY(status)) {
    /* Really shouldn't use stderr here, but where else to complain? */
    L->top--;
    fputs("VM handler failed: ", stderr);
    fputs(tvisstr(L->top) ? strVdata(L->top) : "?", stderr);
    fputc('\n', stderr);
  }
  hook_restore(g, oldh);
  if (g->vmevmask != VMEVENT_NOCACHE)
    g->vmevmask = oldmask;  /* Restore event mask, but not if not modified. */
}